

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::add_extension_fun
          (torrent *this,
          function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
          *ext,client_data_t userdata)

{
  client_data_t __args_1;
  shared_ptr<libtorrent::torrent_plugin> tp;
  undefined1 local_58 [16];
  __shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  get_handle((torrent *)&stack0xffffffffffffffc8);
  __args_1.m_client_ptr = userdata.m_type_ptr;
  __args_1.m_type_ptr = (char *)&stack0xffffffffffffffc8;
  ::std::
  function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
  ::operator()((function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
                *)local_58,(torrent_handle *)ext,__args_1);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  if ((void *)local_58._0_8_ != (void *)0x0) {
    ::std::__shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               (__shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    add_extension(this,(shared_ptr<libtorrent::torrent_plugin> *)&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return;
}

Assistant:

void torrent::add_extension_fun(std::function<std::shared_ptr<torrent_plugin>(torrent_handle const&, client_data_t)> const& ext
		, client_data_t userdata)
	{
		std::shared_ptr<torrent_plugin> tp(ext(get_handle(), userdata));
		if (!tp) return;

		add_extension(tp);
	}